

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# corona_loader.cpp
# Opt level: O3

Ref<embree::SceneGraph::MaterialNode> __thiscall
embree::CoronaLoader::loadMaterial(CoronaLoader *this,Ref<embree::XML> *xml)

{
  atomic<unsigned_long> *paVar1;
  pointer pcVar2;
  pointer pRVar3;
  pointer pRVar4;
  MaterialNode *pMVar5;
  undefined4 uVar6;
  undefined8 uVar7;
  int iVar8;
  Node *pNVar9;
  mapped_type *pmVar10;
  runtime_error *this_00;
  long *plVar11;
  long *plVar12;
  Ref<embree::XML> *in_RDX;
  char *pcVar13;
  XML *pXVar14;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_01;
  CoronaLoader *pCVar15;
  pointer pRVar16;
  float fVar17;
  Vec3fa VVar18;
  string name;
  undefined1 local_e8 [32];
  undefined1 local_c8 [40];
  Ref<embree::XML> *local_a0;
  undefined1 local_98 [80];
  _Base_ptr local_48;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_40;
  
  local_a0 = xml;
  iVar8 = std::__cxx11::string::compare((char *)&in_RDX->ptr->name);
  if (iVar8 != 0) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    ParseLocation::str_abi_cxx11_((string *)local_98,&in_RDX->ptr->loc);
    plVar11 = (long *)std::__cxx11::string::append(local_98);
    local_c8._0_8_ = *plVar11;
    plVar12 = plVar11 + 2;
    if ((long *)local_c8._0_8_ == plVar12) {
      local_c8._16_8_ = *plVar12;
      local_c8._24_8_ = plVar11[3];
      local_c8._0_8_ = local_c8 + 0x10;
    }
    else {
      local_c8._16_8_ = *plVar12;
    }
    local_c8._8_8_ = plVar11[1];
    *plVar11 = (long)plVar12;
    plVar11[1] = 0;
    *(undefined1 *)(plVar11 + 2) = 0;
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_e8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c8,
                   &in_RDX->ptr->name);
    std::runtime_error::runtime_error(this_00,(string *)local_e8);
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  plVar11 = (long *)(local_c8 + 0x10);
  local_c8._16_6_ = 0x7373616c63;
  local_c8._8_8_ = 5;
  local_c8._0_8_ = plVar11;
  XML::parm((string *)local_e8,in_RDX->ptr,(string *)local_c8);
  iVar8 = std::__cxx11::string::compare(local_e8);
  pcVar2 = local_e8 + 0x10;
  if ((pointer)local_e8._0_8_ != pcVar2) {
    operator_delete((void *)local_e8._0_8_);
  }
  if ((long *)local_c8._0_8_ != plVar11) {
    operator_delete((void *)local_c8._0_8_);
  }
  if (iVar8 == 0) {
    pNVar9 = (Node *)alignedUSMMalloc(0x180,0x10,DEVICE_READ_ONLY);
    local_48 = (_Base_ptr)0x0;
    local_40._M_local_buf[0] = _S_red;
    local_98._72_8_ = &local_40;
    SceneGraph::Node::Node(pNVar9,(string *)(local_98 + 0x48));
    (pNVar9->super_RefCount)._vptr_RefCount = (_func_int **)&PTR__OBJMaterial_002cdaf8;
    *(undefined4 *)&pNVar9[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i = 0;
    *(undefined4 *)&pNVar9[1].fileName._M_string_length = 0;
    *(undefined8 *)((long)&pNVar9[1].fileName._M_string_length + 4) = 0x3f8000003f800000;
    *(undefined4 *)((long)&pNVar9[1].fileName.field_2 + 4) = 0x3f800000;
    *(undefined8 *)((long)&pNVar9[1].fileName.field_2 + 8) = 0;
    pNVar9[1].name._M_dataplus._M_p = (pointer)0x0;
    *(undefined4 *)&pNVar9[1].name._M_string_length = 0x3f800000;
    *(undefined4 *)((long)&pNVar9[1].name._M_string_length + 4) = 0x3f800000;
    *(undefined4 *)&pNVar9[1].name.field_2 = 0x3f800000;
    *(undefined4 *)((long)&pNVar9[1].name.field_2 + 4) = 0x3f800000;
    *(undefined8 *)((long)&pNVar9[1].name.field_2 + 8) = 0;
    pNVar9[1].indegree = 0;
    pNVar9[1].closed = false;
    pNVar9[1].hasLightOrCamera = false;
    *(undefined2 *)&pNVar9[1].field_0x5a = 0x3f80;
    pNVar9[1].id = 0x3f800000;
    *(undefined4 *)&pNVar9[1].geometry = 0x3f800000;
    *(undefined4 *)((long)&pNVar9[1].geometry + 4) = 0x3f800000;
    local_98._32_8_ = this;
    memset(pNVar9 + 2,0,0xa8);
    LOCK();
    paVar1 = &(pNVar9->super_RefCount).refCounter;
    (paVar1->super___atomic_base<unsigned_long>)._M_i =
         (paVar1->super___atomic_base<unsigned_long>)._M_i + 1;
    UNLOCK();
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._72_8_ != &local_40) {
      operator_delete((void *)local_98._72_8_);
    }
    pRVar3 = (in_RDX->ptr->children).
             super__Vector_base<embree::Ref<embree::XML>,_std::allocator<embree::Ref<embree::XML>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    this = (CoronaLoader *)local_98._32_8_;
    for (pRVar16 = (in_RDX->ptr->children).
                   super__Vector_base<embree::Ref<embree::XML>,_std::allocator<embree::Ref<embree::XML>_>_>
                   ._M_impl.super__Vector_impl_data._M_start; local_98._32_8_ = this,
        pRVar16 != pRVar3; pRVar16 = pRVar16 + 1) {
      pcVar13 = "diffuse";
      iVar8 = std::__cxx11::string::compare((char *)&pRVar16->ptr->name);
      if (iVar8 == 0) {
        load<embree::Vec3fa>((CoronaLoader *)local_e8,(Ref<embree::XML> *)pcVar13);
        pNVar9[1].name._M_string_length = local_e8._0_8_;
        pNVar9[1].name.field_2._M_allocated_capacity = local_e8._8_8_;
        pRVar4 = (pRVar16->ptr->children).
                 super__Vector_base<embree::Ref<embree::XML>,_std::allocator<embree::Ref<embree::XML>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        if (((pRVar16->ptr->children).
             super__Vector_base<embree::Ref<embree::XML>,_std::allocator<embree::Ref<embree::XML>_>_>
             ._M_impl.super__Vector_impl_data._M_finish != pRVar4) &&
           (iVar8 = std::__cxx11::string::compare((char *)&pRVar4->ptr->name), iVar8 == 0)) {
          loadMap((CoronaLoader *)local_e8,local_a0);
          this_01 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pNVar9[2].geometry;
          pNVar9[2].closed = (bool)local_e8[0];
          pNVar9[2].hasLightOrCamera = (bool)local_e8[1];
          *(undefined2 *)&pNVar9[2].field_0x5a = local_e8._2_2_;
          pNVar9[2].id = local_e8._4_4_;
          pNVar9[2].geometry = (void *)local_e8._8_8_;
LAB_001ac84f:
          local_e8._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          local_e8._0_8_ = (pointer)0x0;
          if ((this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
             (std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01),
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_e8._8_8_ !=
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_e8._8_8_);
          }
        }
      }
      else {
        iVar8 = std::__cxx11::string::compare((char *)&pRVar16->ptr->name);
        if (iVar8 == 0) {
          pXVar14 = pRVar16->ptr;
          local_e8._8_8_ = 5;
          local_e8._16_6_ = 0x726f6c6f63;
          local_e8._0_8_ = pcVar2;
          XML::child((XML *)local_98,(string *)pXVar14);
          VVar18 = load<embree::Vec3fa>((CoronaLoader *)local_c8,(Ref<embree::XML> *)pXVar14);
          *(undefined4 *)((long)&pNVar9[1].name.field_2 + 8) = local_c8._0_4_;
          *(undefined4 *)((long)&pNVar9[1].name.field_2 + 0xc) = local_c8._4_4_;
          *(undefined4 *)&pNVar9[1].indegree = local_c8._8_4_;
          *(undefined4 *)((long)&pNVar9[1].indegree + 4) = local_c8._12_4_;
          if ((_Base_ptr)local_98._0_8_ != (_Base_ptr)0x0) {
            (**(code **)(*(_func_int **)local_98._0_8_ + 0x18))(local_c8._0_4_,VVar18.field_0._8_4_)
            ;
          }
          if ((pointer)local_e8._0_8_ != pcVar2) {
            operator_delete((void *)local_e8._0_8_);
          }
          local_e8._8_8_ = 3;
          local_e8._16_4_ = 0x726f69;
          pCVar15 = (CoronaLoader *)local_c8;
          local_e8._0_8_ = pcVar2;
          XML::child((XML *)local_c8,(string *)pRVar16->ptr);
          fVar17 = load<float>(pCVar15,(Ref<embree::XML> *)local_c8);
          *(float *)((long)&pNVar9[1].fileName.field_2 + 4) = fVar17;
          if ((long *)local_c8._0_8_ != (long *)0x0) {
            (**(code **)(*(long *)local_c8._0_8_ + 0x18))();
          }
          if ((pointer)local_e8._0_8_ != pcVar2) {
            operator_delete((void *)local_e8._0_8_);
          }
          local_e8._16_8_ = 0x656e6973736f6c67;
          local_e8._24_2_ = 0x7373;
          local_e8._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0xa;
          local_e8[0x1a] = '\0';
          pCVar15 = (CoronaLoader *)local_c8;
          local_e8._0_8_ = pcVar2;
          XML::child((XML *)local_c8,(string *)pRVar16->ptr);
          fVar17 = load<float>(pCVar15,(Ref<embree::XML> *)local_c8);
          *(float *)&pNVar9[1].fileName.field_2 = fVar17;
          uVar7 = local_c8._0_8_;
          if ((long *)local_c8._0_8_ != (long *)0x0) {
            (**(code **)(*(long *)local_c8._0_8_ + 0x18))();
            uVar7 = local_c8._0_8_;
          }
        }
        else {
          iVar8 = std::__cxx11::string::compare((char *)&pRVar16->ptr->name);
          if (iVar8 != 0) {
            pcVar13 = "opacity";
            iVar8 = std::__cxx11::string::compare((char *)&pRVar16->ptr->name);
            if (iVar8 == 0) {
              load<embree::Vec3fa>((CoronaLoader *)local_e8,(Ref<embree::XML> *)pcVar13);
              *(undefined4 *)((long)&pNVar9[1].fileName._M_string_length + 4) = local_e8._0_4_;
              pRVar4 = (pRVar16->ptr->children).
                       super__Vector_base<embree::Ref<embree::XML>,_std::allocator<embree::Ref<embree::XML>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              if (((pRVar16->ptr->children).
                   super__Vector_base<embree::Ref<embree::XML>,_std::allocator<embree::Ref<embree::XML>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish != pRVar4) &&
                 (iVar8 = std::__cxx11::string::compare((char *)&pRVar4->ptr->name), iVar8 == 0)) {
                loadMap((CoronaLoader *)local_e8,local_a0);
                this_01 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                          pNVar9[2].name.field_2._M_allocated_capacity;
                pNVar9[2].name._M_string_length = local_e8._0_8_;
                pNVar9[2].name.field_2._M_allocated_capacity = local_e8._8_8_;
                goto LAB_001ac84f;
              }
            }
            goto LAB_001aca05;
          }
          pXVar14 = pRVar16->ptr;
          local_e8._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x5;
          local_e8._16_6_ = 0x726f6c6f63;
          local_e8._0_8_ = pcVar2;
          XML::child((XML *)local_98,(string *)pXVar14);
          VVar18 = load<embree::Vec3fa>((CoronaLoader *)local_c8,(Ref<embree::XML> *)pXVar14);
          uVar7 = local_c8._0_8_;
          pNVar9[1].closed = (bool)local_c8[0];
          pNVar9[1].hasLightOrCamera = (bool)local_c8[1];
          *(undefined2 *)&pNVar9[1].field_0x5a = local_c8._2_2_;
          pNVar9[1].id = local_c8._4_4_;
          *(undefined4 *)&pNVar9[1].geometry = local_c8._8_4_;
          *(undefined4 *)((long)&pNVar9[1].geometry + 4) = local_c8._12_4_;
          if ((_Base_ptr)local_98._0_8_ != (_Base_ptr)0x0) {
            uVar6 = local_c8._0_4_;
            local_c8._0_8_ = uVar7;
            (**(code **)(*(_func_int **)local_98._0_8_ + 0x18))(uVar6,VVar18.field_0._8_4_);
            uVar7 = local_c8._0_8_;
          }
        }
        local_c8._0_8_ = uVar7;
        if ((pointer)local_e8._0_8_ != pcVar2) {
          operator_delete((void *)local_e8._0_8_);
        }
      }
LAB_001aca05:
      this = (CoronaLoader *)local_98._32_8_;
    }
    (((Node *)&this->path)->super_RefCount)._vptr_RefCount = (_func_int **)pNVar9;
    (*(pNVar9->super_RefCount)._vptr_RefCount[2])(pNVar9);
    (*(pNVar9->super_RefCount)._vptr_RefCount[3])(pNVar9);
  }
  else {
    local_c8._16_6_ = 0x7373616c63;
    local_c8._8_8_ = 5;
    local_c8._0_8_ = plVar11;
    XML::parm((string *)local_e8,in_RDX->ptr,(string *)local_c8);
    pcVar13 = "Reference";
    iVar8 = std::__cxx11::string::compare(local_e8);
    if ((pointer)local_e8._0_8_ != pcVar2) {
      operator_delete((void *)local_e8._0_8_);
    }
    if ((long *)local_c8._0_8_ != plVar11) {
      operator_delete((void *)local_c8._0_8_);
    }
    if (iVar8 == 0) {
      load<std::__cxx11::string>((string *)local_e8,(CoronaLoader *)pcVar13,in_RDX);
      pmVar10 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::MaterialNode>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::MaterialNode>_>_>_>
                ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::MaterialNode>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::MaterialNode>_>_>_>
                              *)(local_a0 + 4),(key_type *)local_e8);
      pMVar5 = pmVar10->ptr;
      (this->path).filename._M_dataplus._M_p = (pointer)pMVar5;
      if (pMVar5 != (MaterialNode *)0x0) {
        (**(code **)((long)(pMVar5->super_Node).super_RefCount._vptr_RefCount + 0x10))();
      }
      if ((pointer)local_e8._0_8_ == pcVar2) {
        return (Ref<embree::SceneGraph::MaterialNode>)this;
      }
    }
    else {
      pNVar9 = (Node *)alignedUSMMalloc(0x180,0x10,DEVICE_READ_ONLY);
      local_98._48_8_ = (pointer)0x0;
      local_98[0x38] = _S_red;
      local_98._40_8_ = local_98 + 0x38;
      SceneGraph::Node::Node(pNVar9,(string *)(local_98 + 0x28));
      (pNVar9->super_RefCount)._vptr_RefCount = (_func_int **)&PTR__OBJMaterial_002cdaf8;
      *(undefined4 *)&pNVar9[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i =
           0;
      *(undefined4 *)&pNVar9[1].fileName._M_string_length = 0;
      *(undefined8 *)((long)&pNVar9[1].fileName._M_string_length + 4) = 0x3f8000003f800000;
      *(undefined4 *)((long)&pNVar9[1].fileName.field_2 + 4) = 0x3f800000;
      *(undefined8 *)((long)&pNVar9[1].fileName.field_2 + 8) = 0;
      pNVar9[1].name._M_dataplus._M_p = (pointer)0x0;
      pNVar9[1].name._M_string_length = 0x3f8000003f800000;
      pNVar9[1].name.field_2._M_allocated_capacity = 0x3f8000003f800000;
      *(undefined8 *)((long)&pNVar9[1].name.field_2 + 8) = 0;
      pNVar9[1].indegree = 0;
      pNVar9[1].closed = false;
      pNVar9[1].hasLightOrCamera = false;
      *(undefined2 *)&pNVar9[1].field_0x5a = 0x3f80;
      pNVar9[1].id = 0x3f800000;
      pNVar9[1].geometry = (void *)0x3f8000003f800000;
      memset(pNVar9 + 2,0,0xa8);
      (this->path).filename._M_dataplus._M_p = (pointer)pNVar9;
      LOCK();
      paVar1 = &(pNVar9->super_RefCount).refCounter;
      (paVar1->super___atomic_base<unsigned_long>)._M_i =
           (paVar1->super___atomic_base<unsigned_long>)._M_i + 1;
      UNLOCK();
      local_e8._0_8_ = local_98._40_8_;
      if ((undefined1 *)local_98._40_8_ == local_98 + 0x38) {
        return (Ref<embree::SceneGraph::MaterialNode>)this;
      }
    }
    operator_delete((void *)local_e8._0_8_);
  }
  return (Ref<embree::SceneGraph::MaterialNode>)(MaterialNode *)this;
}

Assistant:

Ref<SceneGraph::MaterialNode> CoronaLoader::loadMaterial(const Ref<XML>& xml) 
  {
    if (xml->name != "material") 
      THROW_RUNTIME_ERROR(xml->loc.str()+": invalid material: "+xml->name);

    /* native material */
    if (xml->parm("class") == "Native") 
    {
      /* we convert into an OBJ material */
      Ref<OBJMaterial> objmaterial = new OBJMaterial;
      for (auto& child : xml->children)
      {
        if (child->name == "diffuse") {
          objmaterial->Kd = load<Vec3fa>(child);
          if (child->children.size() && child->children[0]->name == "map")
            objmaterial->_map_Kd = loadMap(child->children[0]);
        }
        else if (child->name == "reflect") {
          objmaterial->Ks = load<Vec3fa>(child->child("color"));
          objmaterial->Ni = load<float >(child->child("ior"));
          objmaterial->Ns = load<float >(child->child("glossiness"));
        }
        else if (child->name == "translucency") {
          objmaterial->Kt = load<Vec3fa>(child->child("color"));
        }
        else if (child->name == "opacity") {
          objmaterial->d = load<Vec3fa>(child).x;
          if (child->children.size() && child->children[0]->name == "map")
            objmaterial->_map_d = loadMap(child->children[0]);
        }
      }
      return objmaterial.dynamicCast<SceneGraph::MaterialNode>();
    }

    /* reference by name */
    else if (xml->parm("class") == "Reference") 
    {
      const std::string name = load<std::string>(xml);
      return materialMap[name];
    }

    /* else return default material */
    else 
      return new OBJMaterial;
  }